

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_mDCV_fixed
               (png_structrp png_ptr,png_uint_16 red_x,png_uint_16 red_y,png_uint_16 green_x,
               png_uint_16 green_y,png_uint_16 blue_x,png_uint_16 blue_y,png_uint_16 white_x,
               png_uint_16 white_y,png_uint_32 maxDL,png_uint_32 minDL)

{
  png_byte local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  local_28 = (png_byte)(red_x >> 8);
  local_27 = (undefined1)red_x;
  local_26 = (undefined1)(red_y >> 8);
  local_25 = (undefined1)red_y;
  local_24 = (undefined1)(green_x >> 8);
  local_23 = (undefined1)green_x;
  local_22 = (undefined1)(green_y >> 8);
  local_21 = (undefined1)green_y;
  local_20 = (undefined1)(blue_x >> 8);
  local_1f = (undefined1)blue_x;
  local_1e = (undefined1)(blue_y >> 8);
  local_1d = (undefined1)blue_y;
  local_1c = (undefined1)(white_x >> 8);
  local_1b = (undefined1)white_x;
  local_1a = (undefined1)(white_y >> 8);
  local_19 = (undefined1)white_y;
  local_18 = (undefined1)(maxDL >> 0x18);
  local_17 = (undefined1)(maxDL >> 0x10);
  local_16 = (undefined1)(maxDL >> 8);
  local_15 = (undefined1)maxDL;
  local_14 = (undefined1)(minDL >> 0x18);
  local_13 = (undefined1)(minDL >> 0x10);
  local_12 = (undefined1)(minDL >> 8);
  local_11 = (undefined1)minDL;
  png_write_complete_chunk(png_ptr,0x6d444356,&local_28,0x18);
  return;
}

Assistant:

void /* PRIVATE */
png_write_mDCV_fixed(png_structrp png_ptr,
   png_uint_16 red_x, png_uint_16 red_y,
   png_uint_16 green_x, png_uint_16 green_y,
   png_uint_16 blue_x, png_uint_16 blue_y,
   png_uint_16 white_x, png_uint_16 white_y,
   png_uint_32 maxDL, png_uint_32 minDL)
{
   png_byte buf[24];

   png_debug(1, "in png_write_mDCV_fixed");

   png_save_uint_16(buf +  0, red_x);
   png_save_uint_16(buf +  2, red_y);
   png_save_uint_16(buf +  4, green_x);
   png_save_uint_16(buf +  6, green_y);
   png_save_uint_16(buf +  8, blue_x);
   png_save_uint_16(buf + 10, blue_y);
   png_save_uint_16(buf + 12, white_x);
   png_save_uint_16(buf + 14, white_y);
   png_save_uint_32(buf + 16, maxDL);
   png_save_uint_32(buf + 20, minDL);

   png_write_complete_chunk(png_ptr, png_mDCV, buf, 24);
}